

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode TA_SetInputParamRealPtr(TA_ParamHolder *param,uint paramIndex,TA_Real *value)

{
  int *piVar1;
  int *piVar2;
  byte bVar3;
  TA_RetCode TVar4;
  
  if (value == (TA_Real *)0x0 || param == (TA_ParamHolder *)0x0) {
    return TA_BAD_PARAM;
  }
  piVar1 = (int *)param->hiddenData;
  if (*piVar1 == -0x5dfd4dfe) {
    if (*(long *)(piVar1 + 10) == 0) {
      TVar4 = TA_INVALID_HANDLE;
    }
    else {
      if (*(uint *)(*(long *)(piVar1 + 10) + 0x24) <= paramIndex) {
        return TA_BAD_PARAM;
      }
      piVar2 = *(int **)(*(long *)(piVar1 + 2) + 0x30 + (ulong)paramIndex * 0x38);
      if (piVar2 == (int *)0x0) {
        return TA_INTERNAL_ERROR|TA_BAD_PARAM;
      }
      if (*piVar2 == 1) {
        *(TA_Real **)(*(long *)(piVar1 + 2) + (ulong)paramIndex * 0x38) = value;
        bVar3 = (byte)paramIndex & 0x1f;
        piVar1[8] = piVar1[8] & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
        return TA_SUCCESS;
      }
      TVar4 = TA_INVALID_PARAM_HOLDER_TYPE;
    }
  }
  else {
    TVar4 = TA_INVALID_PARAM_HOLDER;
  }
  return TVar4;
}

Assistant:

TA_RetCode TA_SetInputParamRealPtr( TA_ParamHolder *param,
                                    unsigned int paramIndex,
                                    const TA_Real *value )
{   
   TA_ParamHolderPriv *paramHolderPriv;
   const TA_InputParameterInfo *paramInfo;
   const TA_FuncInfo *funcInfo;

   if( (param == NULL) || (value == NULL) )
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Make sure this index really exist. */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;

   if( paramIndex >= funcInfo->nbInput )
   {
      return TA_BAD_PARAM;
   }   

   /* Verify the type of the parameter. */
   paramInfo = paramHolderPriv->in[paramIndex].inputInfo;
   if( !paramInfo ) return TA_INTERNAL_ERROR(2);
   if( paramInfo->type != TA_Input_Real )
   {
      return TA_INVALID_PARAM_HOLDER_TYPE;
   }

   /* keep a copy of the provided parameter. */
   paramHolderPriv->in[paramIndex].data.inReal = value; 

   /* This parameter is now initialized, clear the corresponding bit. */
   paramHolderPriv->inBitmap &= ~(1<<paramIndex);

   return TA_SUCCESS;
}